

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_profiler.c
# Opt level: O1

int sunCompareTimes(void *l,void *r)

{
  double dVar1;
  double dVar2;
  long lVar3;
  long lVar4;
  
  lVar3 = *l;
  lVar4 = *r;
  if (lVar4 == 0 || lVar3 == 0) {
    return -(uint)(lVar3 != 0) | (uint)(lVar3 != 0 || lVar4 != 0);
  }
  dVar1 = *(double *)(*(long *)(lVar3 + 8) + 0x18);
  dVar2 = *(double *)(*(long *)(lVar4 + 8) + 0x18);
  if (dVar1 < dVar2) {
    return 1;
  }
  return -(uint)(dVar2 < dVar1);
}

Assistant:

int sunCompareTimes(const void* l, const void* r)
{
  double left_max;
  double right_max;

  const SUNHashMapKeyValue left  = *((const SUNHashMapKeyValue*)l);
  const SUNHashMapKeyValue right = *((const SUNHashMapKeyValue*)r);

  if (left == NULL && right == NULL) { return 0; }
  if (left == NULL) { return 1; }
  if (right == NULL) { return -1; }

  left_max  = ((sunTimerStruct*)left->value)->maximum;
  right_max = ((sunTimerStruct*)right->value)->maximum;

  if (left_max < right_max) { return 1; }
  if (left_max > right_max) { return -1; }

  return 0;
}